

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

void __thiscall
Memory::LargeHeapBlock::ResetMarks(LargeHeapBlock *this,ResetMarkFlags flags,Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  undefined4 *puVar5;
  LargeObjectHeader *this_00;
  uint objectIndex;
  uint index;
  
  if ((this->super_HeapBlock).needOOMRescan == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x381,"(!this->needOOMRescan)","!this->needOOMRescan");
    if (!bVar2) goto LAB_0065cd05;
    *puVar5 = 0;
  }
  this->lastCollectAllocCount = this->allocCount;
  uVar4 = GetMarkCount(this);
  if (uVar4 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x386,"(this->GetMarkCount() == 0)","this->GetMarkCount() == 0");
    if (!bVar2) goto LAB_0065cd05;
    *puVar5 = 0;
  }
  if ((this->super_HeapBlock).isPendingConcurrentSweep == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x389,"(!this->isPendingConcurrentSweep)","!this->isPendingConcurrentSweep")
    ;
    if (!bVar2) {
LAB_0065cd05:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  if ((flags & ResetMarkFlags_InThreadImplicitRoots) != ResetMarkFlags_HeapEnumeration) {
    for (index = 0; index < this->allocCount; index = index + 1) {
      this_00 = GetHeaderByIndex(this,index);
      if (this_00 != (LargeObjectHeader *)0x0) {
        bVar3 = LargeObjectHeader::GetAttributes(this_00,this->heapInfo->recycler->Cookie);
        if ((bVar3 & 8) != 0) {
          HeapBlockMap64::SetMark(&recycler->heapBlockMap,this_00 + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void
LargeHeapBlock::ResetMarks(ResetMarkFlags flags, Recycler* recycler)
{
    Assert(!this->needOOMRescan);

    // Update the lastCollectAllocCount for sweep
    this->lastCollectAllocCount = this->allocCount;

    Assert(this->GetMarkCount() == 0);

#if ENABLE_CONCURRENT_GC
    Assert(!this->isPendingConcurrentSweep);
#endif

    if (flags & ResetMarkFlags_ScanImplicitRoot)
    {
        for (uint objectIndex = 0; objectIndex < allocCount; objectIndex++)
        {
            // object is allocated during the concurrent mark or it is marked, do rescan
            LargeObjectHeader * header = this->GetHeaderByIndex(objectIndex);
            // check if the object index is not allocated
            if (header == nullptr)
            {
                continue;
            }

            // check whether the object is a leaf and doesn't need to be scanned
            if ((header->GetAttributes(this->heapInfo->recycler->Cookie) & ImplicitRootBit) != 0)
            {
                recycler->heapBlockMap.SetMark(header->GetAddress());
            }
        }
    }
}